

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void __thiscall EDCircles::ValidateCircles(EDCircles *this)

{
  uchar uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  NFALUT *pNVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  int local_184;
  undefined1 local_150 [8];
  EllipseEquation eq;
  double ellipseFitError;
  bool isValid;
  double circumference;
  double diff;
  double idealPixelAngle;
  double derivY;
  double derivX;
  double pixelAngle;
  int gy;
  int gx;
  int com2;
  int com1;
  int diff2;
  int diff1;
  int y;
  int x;
  int dc;
  int dr;
  int c;
  int r;
  int j;
  int aligned;
  int noEdgePixels;
  int noPeripheryPixels;
  int tcount;
  int tc;
  int tr;
  int pc;
  int pr;
  int noPoints;
  double radius;
  double yc;
  double xc;
  Circle *circle;
  int i;
  int count;
  bool validateAgain;
  int local_44;
  double dStack_40;
  int lutSize;
  double logNT;
  double *py;
  double *px;
  double dStack_20;
  int points_buffer_size;
  double prob;
  double prec;
  EDCircles *this_local;
  
  prob = 0.19634954084936207;
  dStack_20 = 0.125;
  px._4_4_ = ((this->super_EDPF).super_ED.width + (this->super_EDPF).super_ED.height) * 8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)px._4_4_;
  uVar9 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  prec = (double)this;
  py = (double *)operator_new__(uVar9);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)px._4_4_;
  uVar9 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  logNT = (double)operator_new__(uVar9);
  dVar12 = log10((double)((this->super_EDPF).super_ED.width * (this->super_EDPF).super_ED.height));
  dStack_40 = log10((double)((this->super_EDPF).super_ED.width + (this->super_EDPF).super_ED.height)
                   );
  dStack_40 = dVar12 + dVar12 + dStack_40;
  iVar5 = (this->super_EDPF).super_ED.width;
  iVar6 = (this->super_EDPF).super_ED.height;
  local_44 = iVar5 + iVar6;
  if (local_44 < 0) {
    local_44 = iVar5 + 7 + iVar6;
  }
  local_44 = local_44 >> 3;
  pNVar10 = (NFALUT *)operator_new(0x20);
  NFALUT::NFALUT(pNVar10,local_44,dStack_20,dStack_40);
  this->nfa = pNVar10;
  circle._4_4_ = 0;
  circle._0_4_ = 0;
  do {
    while( true ) {
      while( true ) {
        if (this->noCircles1 <= (int)circle) {
          this->noCircles2 = circle._4_4_;
          if (py != (double *)0x0) {
            operator_delete__(py);
          }
          if (logNT != 0.0) {
            operator_delete__((void *)logNT);
          }
          pNVar10 = this->nfa;
          if (pNVar10 != (NFALUT *)0x0) {
            NFALUT::~NFALUT(pNVar10);
            operator_delete(pNVar10);
          }
          return;
        }
        xc = (double)(this->circles1 + (int)circle);
        yc = ((Circle *)xc)->xc;
        radius = ((Circle *)xc)->yc;
        _pr = ((Circle *)xc)->r;
        if ((this->super_EDPF).super_ED.width < (this->super_EDPF).super_ED.height) {
          local_184 = (this->super_EDPF).super_ED.height;
        }
        else {
          local_184 = (this->super_EDPF).super_ED.width;
        }
        if (_pr <= (double)local_184) break;
        circle._0_4_ = (int)circle + 1;
      }
      i._3_1_ = 0;
      dVar12 = computeEllipsePerimeter(&((Circle *)xc)->eq);
      pc = (int)dVar12;
      if (pc <= px._4_4_) break;
      circle._0_4_ = (int)circle + 1;
    }
    if ((*(byte *)((long)xc + 0x80) & 1) == 0) {
      ComputeCirclePoints(yc,radius,_pr,py,(double *)logNT,&pc);
    }
    else {
      if (pc % 2 != 0) {
        pc = pc + -1;
      }
      ComputeEllipsePoints((double *)((long)xc + 0x40),py,(double *)logNT,pc);
    }
    tr = -1;
    tc = -1;
    tcount = -100;
    noPeripheryPixels = -100;
    aligned = 0;
    r = 0;
    for (c = 0; c < pc; c = c + 1) {
      iVar5 = (int)(*(double *)((long)logNT + (long)c * 8) + 0.5);
      iVar6 = (int)(py[c] + 0.5);
      if (((((iVar5 == tr) && (iVar6 == tc)) || (aligned = aligned + 1, iVar5 < 1)) ||
          (((this->super_EDPF).super_ED.height + -1 <= iVar5 || (iVar6 < 1)))) ||
         ((this->super_EDPF).super_ED.width + -1 <= iVar6)) goto LAB_0011c354;
      iVar7 = iVar5 - tcount;
      if (iVar7 < 1) {
        iVar7 = -iVar7;
      }
      iVar8 = iVar6 - noPeripheryPixels;
      if (iVar8 < 1) {
        iVar8 = -iVar8;
      }
      if (1 < iVar7 + iVar8) {
        noPeripheryPixels = iVar6;
        tcount = iVar5;
      }
      dc = iVar6;
      dr = iVar5;
      tc = iVar6;
      tr = iVar5;
      if ((this->super_EDPF).super_ED.edgeImg[iVar5 * (this->super_EDPF).super_ED.width + iVar6] ==
          0xff) {
LAB_0011bfb2:
        iVar5 = (uint)(this->super_EDPF).super_ED.smoothImg
                      [(dr + 1) * (this->super_EDPF).super_ED.width + dc + 1] -
                (uint)(this->super_EDPF).super_ED.smoothImg
                      [(dr + -1) * (this->super_EDPF).super_ED.width + dc + -1];
        iVar6 = (uint)(this->super_EDPF).super_ED.smoothImg
                      [(dr + -1) * (this->super_EDPF).super_ED.width + dc + 1] -
                (uint)(this->super_EDPF).super_ED.smoothImg
                      [(dr + 1) * (this->super_EDPF).super_ED.width + dc + -1];
        dVar12 = NFALUT::myAtan2((double)(int)((iVar5 + iVar6 +
                                               (uint)(this->super_EDPF).super_ED.smoothImg
                                                     [dr * (this->super_EDPF).super_ED.width + dc +
                                                      1]) -
                                              (uint)(this->super_EDPF).super_ED.smoothImg
                                                    [dr * (this->super_EDPF).super_ED.width + dc +
                                                     -1]),
                                 (double)(int)-(((iVar5 - iVar6) +
                                                (uint)(this->super_EDPF).super_ED.smoothImg
                                                      [(dr + 1) * (this->super_EDPF).super_ED.width
                                                       + dc]) -
                                               (uint)(this->super_EDPF).super_ED.smoothImg
                                                     [(dr + -1) * (this->super_EDPF).super_ED.width
                                                      + dc]));
        if ((*(byte *)((long)xc + 0x80) & 1) == 0) {
          derivY = (double)dc - yc;
          idealPixelAngle = (double)dr - radius;
        }
        else {
          dVar13 = EllipseEquation::A((EllipseEquation *)((long)xc + 0x40));
          dVar14 = EllipseEquation::B((EllipseEquation *)((long)xc + 0x40));
          dVar15 = EllipseEquation::D((EllipseEquation *)((long)xc + 0x40));
          derivY = dVar13 * 2.0 * (double)dc + dVar14 * (double)dr + dVar15;
          dVar13 = EllipseEquation::B((EllipseEquation *)((long)xc + 0x40));
          dVar14 = EllipseEquation::C((EllipseEquation *)((long)xc + 0x40));
          dVar15 = EllipseEquation::E((EllipseEquation *)((long)xc + 0x40));
          idealPixelAngle = dVar13 * (double)dc + dVar14 * 2.0 * (double)dr + dVar15;
        }
        dVar13 = NFALUT::myAtan2(derivY,-idealPixelAngle);
        if ((ABS(dVar12 - dVar13) <= prob) || (3.141592653589793 - prob <= ABS(dVar12 - dVar13))) {
          r = r + 1;
        }
      }
      else {
        iVar7 = (int)((((double)iVar5 - radius) + (double)iVar6) - yc);
        if (-1 < (int)((((double)iVar5 - radius) - (double)iVar6) + yc)) {
          if (iVar7 < 1) {
            dc = iVar6 + -1;
            if ((((dc < 1) ||
                 ((this->super_EDPF).super_ED.edgeImg
                  [iVar5 * (this->super_EDPF).super_ED.width + dc] != 0xff)) &&
                ((dc = iVar6 + 1, (this->super_EDPF).super_ED.width + -1 <= dc ||
                 ((this->super_EDPF).super_ED.edgeImg
                  [iVar5 * (this->super_EDPF).super_ED.width + dc] != 0xff)))) &&
               ((dc = iVar6 + -2, dc < 2 ||
                ((this->super_EDPF).super_ED.edgeImg[iVar5 * (this->super_EDPF).super_ED.width + dc]
                 != 0xff)))) {
              dc = iVar6 + 2;
              if (dc < (this->super_EDPF).super_ED.width + -2) {
                uVar1 = (this->super_EDPF).super_ED.edgeImg
                        [iVar5 * (this->super_EDPF).super_ED.width + dc];
                goto joined_r0x0011bf8e;
              }
              goto LAB_0011c354;
            }
          }
          else {
            dr = iVar5 + -1;
            if ((((dr < 1) ||
                 ((this->super_EDPF).super_ED.edgeImg
                  [dr * (this->super_EDPF).super_ED.width + iVar6] != 0xff)) &&
                ((dr = iVar5 + 1, (this->super_EDPF).super_ED.height + -1 <= dr ||
                 ((this->super_EDPF).super_ED.edgeImg
                  [dr * (this->super_EDPF).super_ED.width + iVar6] != 0xff)))) &&
               ((dr = iVar5 + -2, dr < 2 ||
                ((this->super_EDPF).super_ED.edgeImg[dr * (this->super_EDPF).super_ED.width + iVar6]
                 != 0xff)))) {
              dr = iVar5 + 2;
              if (dr < (this->super_EDPF).super_ED.height + -2) {
                uVar1 = (this->super_EDPF).super_ED.edgeImg
                        [dr * (this->super_EDPF).super_ED.width + iVar6];
joined_r0x0011bf8e:
                if (uVar1 == 0xff) goto LAB_0011bfb2;
              }
              goto LAB_0011c354;
            }
          }
          goto LAB_0011bfb2;
        }
        if (iVar7 < 1) {
          dr = iVar5 + -1;
          if ((((0 < dr) &&
               ((this->super_EDPF).super_ED.edgeImg[dr * (this->super_EDPF).super_ED.width + iVar6]
                == 0xff)) ||
              ((dr = iVar5 + 1, dr < (this->super_EDPF).super_ED.height + -1 &&
               ((this->super_EDPF).super_ED.edgeImg[dr * (this->super_EDPF).super_ED.width + iVar6]
                == 0xff)))) ||
             ((dr = iVar5 + -2, 1 < dr &&
              ((this->super_EDPF).super_ED.edgeImg[dr * (this->super_EDPF).super_ED.width + iVar6]
               == 0xff)))) goto LAB_0011bfb2;
          dr = iVar5 + 2;
          if (dr < (this->super_EDPF).super_ED.height + -2) {
            uVar1 = (this->super_EDPF).super_ED.edgeImg
                    [dr * (this->super_EDPF).super_ED.width + iVar6];
            goto joined_r0x0011bf8e;
          }
        }
        else {
          dc = iVar6 + -1;
          if ((((0 < dc) &&
               ((this->super_EDPF).super_ED.edgeImg[iVar5 * (this->super_EDPF).super_ED.width + dc]
                == 0xff)) ||
              ((dc = iVar6 + 1, dc < (this->super_EDPF).super_ED.width + -1 &&
               ((this->super_EDPF).super_ED.edgeImg[iVar5 * (this->super_EDPF).super_ED.width + dc]
                == 0xff)))) ||
             ((dc = iVar6 + -2, 1 < dc &&
              ((this->super_EDPF).super_ED.edgeImg[iVar5 * (this->super_EDPF).super_ED.width + dc]
               == 0xff)))) goto LAB_0011bfb2;
          dc = iVar6 + 2;
          if (dc < (this->super_EDPF).super_ED.width + -2) {
            uVar1 = (this->super_EDPF).super_ED.edgeImg
                    [iVar5 * (this->super_EDPF).super_ED.width + dc];
            goto joined_r0x0011bf8e;
          }
        }
      }
LAB_0011c354:
    }
    if ((*(byte *)((long)xc + 0x80) & 1) != 0) {
      computeEllipsePerimeter((EllipseEquation *)((long)xc + 0x40));
    }
    bVar4 = NFALUT::checkValidationByNFA(this->nfa,aligned,r);
    if (bVar4) {
      lVar11 = (long)circle._4_4_;
      circle._4_4_ = circle._4_4_ + 1;
      memcpy(this->circles2 + lVar11,this->circles1 + (int)circle,0x98);
    }
    else if (((*(byte *)((long)xc + 0x80) & 1) == 0) && (0.5 <= *(double *)((long)xc + 0x20))) {
      eq.coeff[6] = 10000000000.0;
      EllipseEquation::EllipseEquation((EllipseEquation *)local_150);
      bVar4 = EllipseFit(*(double **)((long)xc + 0x28),*(double **)((long)xc + 0x30),
                         *(int *)((long)xc + 0x38),(EllipseEquation *)local_150,1);
      if (bVar4) {
        eq.coeff[6] = ComputeEllipseError((EllipseEquation *)local_150,*(double **)((long)xc + 0x28)
                                          ,*(double **)((long)xc + 0x30),*(int *)((long)xc + 0x38));
      }
      if (eq.coeff[6] <= 1.5) {
        *(undefined1 *)((long)xc + 0x80) = 1;
        *(double *)((long)xc + 0x78) = eq.coeff[6];
        memcpy((void *)((long)xc + 0x40),local_150,0x38);
        i._3_1_ = 1;
      }
    }
    if ((i._3_1_ & 1) == 0) {
      circle._0_4_ = (int)circle + 1;
    }
  } while( true );
}

Assistant:

void EDCircles::ValidateCircles()
{
	double prec = PI / 16;  // Alignment precision
	double prob = 1.0 / 8;  // probability of alignment

	int points_buffer_size = 8 * (width + height);
	double *px = new double[points_buffer_size];
	double *py = new double[points_buffer_size];

	// logNT & LUT for NFA computation
	double logNT = 2 * log10((double)(width*height)) + log10((double)(width + height));

	int lutSize = (width + height) / 8;
	nfa = new NFALUT(lutSize, prob, logNT); // create look up table

	// Validate circles & ellipses
	bool validateAgain;
	int count = 0;
	for (int i = 0; i<noCircles1; ) {
		Circle *circle = &circles1[i];
		double xc = circle->xc;
		double yc = circle->yc;
		double radius = circle->r;

		// Skip potential invalid circles (sometimes these kinds of candidates get generated!)
		if (radius > MAX(width, height)) { i++; continue; }

		validateAgain = false;

		int noPoints = (int)(computeEllipsePerimeter(&circle->eq));

		if (noPoints > points_buffer_size)
		{
			i++;
			continue;
		}

		if (circle->isEllipse) {
			if (noPoints % 2) noPoints--;
			ComputeEllipsePoints(circle->eq.coeff, px, py, noPoints);

		}
		else {
			ComputeCirclePoints(xc, yc, radius, px, py, &noPoints);
		} //end-else

		int pr = -1;  // previous row
		int pc = -1;  // previous column

		int tr = -100;
		int tc = -100;
		int tcount = 0;

		int noPeripheryPixels = 0;
		int noEdgePixels = 0;
		int aligned = 0;
		for (int j = 0; j<noPoints; j++) {
			int r = (int)(py[j] + 0.5);
			int c = (int)(px[j] + 0.5);

			if (r == pr && c == pc) continue;
			noPeripheryPixels++;

			if (r <= 0 || r >= height - 1) continue;
			if (c <= 0 || c >= width - 1) continue;

			pr = r;
			pc = c;

			int dr = abs(r - tr);
			int dc = abs(c - tc);
			if (dr + dc >= 2) {
				tr = r;
				tc = c;
				tcount++;
			} //end-if

#if 1
			  //
			  // See if there is an edge pixel within 1 pixel vicinity
			  //
			if (edgeImg[r*width + c] != 255) {
				//   y-cy=-x-cx    y-cy=x-cx
				//         \       /
				//          \ IV. /
				//           \   / 
				//            \ / 
				//     III.    +   I. quadrant
				//            / \
				//           /   \ 
				//          / II. \
				//         /       \
				//
				// (x, y)-->(x-cx, y-cy)
				//
				
				int x = c;
				int y = r;

				int diff1 = (int)(y - yc - x + xc);
				int diff2 = (int)(y - yc + x - xc);

				if (diff1 < 0) {
					if (diff2 > 0) {
						// I. quadrant
						c = x - 1;
						if (c >= 1 && edgeImg[r*width + c] == 255) goto out;
						c = x + 1;
						if (c<width - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						c = x - 2;
						if (c >= 2 && edgeImg[r*width + c] == 255) goto out;
						c = x + 2;
						if (c<width - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					}
					else {
						// IV. quadrant
						r = y - 1;
						if (r >= 1 && edgeImg[r*width + c] == 255) goto out;
						r = y + 1;
						if (r<height - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						r = y - 2;
						if (r >= 2 && edgeImg[r*width + c] == 255) goto out;
						r = y + 2;
						if (r<height - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					} //end-else

				}
				else {
					if (diff2 > 0) {
						// II. quadrant
						r = y - 1;
						if (r >= 1 && edgeImg[r*width + c] == 255) goto out;
						r = y + 1;
						if (r<height - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						r = y - 2;
						if (r >= 2 && edgeImg[r*width + c] == 255) goto out;
						r = y + 2;
						if (r<height - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					}
					else {
						// III. quadrant
						c = x - 1;
						if (c >= 1 && edgeImg[r*width + c] == 255) goto out;
						c = x + 1;
						if (c<width - 1 && edgeImg[r*width + c] == 255) goto out;

#if 1
						c = x - 2;
						if (c >= 2 && edgeImg[r*width + c] == 255) goto out;
						c = x + 2;
						if (c<width - 2 && edgeImg[r*width + c] == 255) goto out;
#endif
					} //end-else
				} //end-else

				r = pr;
				c = pc;
				continue;  // Ignore non-edge pixels. 
						   // This produces less false positives, but occationally misses on some valid circles
			} //end-if
		out:
			if (edgeImg[r*width + c] == 255) noEdgePixels++;
			//      map->edgeImg[r*width+c] = 254;
#endif

			// compute gx & gy
			int com1 = smoothImg[(r + 1)*width + c + 1] - smoothImg[(r - 1)*width + c - 1];
			int com2 = smoothImg[(r - 1)*width + c + 1] - smoothImg[(r + 1)*width + c - 1];

			int gx = com1 + com2 + smoothImg[r*width + c + 1] - smoothImg[r*width + c - 1];
			int gy = com1 - com2 + smoothImg[(r + 1)*width + c] - smoothImg[(r - 1)*width + c];
			double pixelAngle = nfa->myAtan2((double)gx, (double)-gy);

			double derivX, derivY;
			if (circle->isEllipse) {
				// Ellipse
				derivX = 2 * circle->eq.A()*c + circle->eq.B()*r + circle->eq.D();
				derivY = circle->eq.B()*c + 2 * circle->eq.C()*r + circle->eq.E();

			}
			else {
				// circle
				derivX = c - xc;
				derivY = r - yc;
			} //end-else

			double idealPixelAngle = nfa->myAtan2(derivX, -derivY);
			double diff = fabs(pixelAngle - idealPixelAngle);
			if (diff <= prec || diff >= PI - prec) aligned++;
		} //end-for

		double circumference;
		if (circle->isEllipse) circumference = computeEllipsePerimeter(&circle->eq);
		else                   circumference = TWOPI*radius;

		// Validate by NFA
		bool isValid = nfa->checkValidationByNFA(noPeripheryPixels, aligned);

		if (isValid) {
			circles2[count++] = circles1[i];

		}
		else if (circle->isEllipse == false && circle->coverRatio >= CANDIDATE_ELLIPSE_RATIO) {
			// Fit an ellipse to this circle, and try to revalidate
			double ellipseFitError = 1e10;
			EllipseEquation eq;

			if (EllipseFit(circle->x, circle->y, circle->noPixels, &eq)) {
				ellipseFitError = ComputeEllipseError(&eq, circle->x, circle->y, circle->noPixels);
			} //end-if

			if (ellipseFitError <= ELLIPSE_ERROR) {
				circle->isEllipse = true;
				circle->ellipseFitError = ellipseFitError;
				circle->eq = eq;

				validateAgain = true;
			} //end-if
		} //end-else

		if (validateAgain == false) i++;
	} //end-for

	noCircles2 = count;

	delete[] px;
	delete[] py;
	delete nfa;
}